

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O3

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandScope::compileDeclExpression
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandScope *this,
          Reader source,Resolver *resolver,ImplicitParams implicitMethodParams)

{
  uint *puVar1;
  anon_union_96_1_a8a2e026_for_OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_2
  *paVar2;
  ErrorReporter *pEVar3;
  undefined2 *puVar4;
  Reader source_00;
  Reader source_01;
  Reader source_02;
  ImplicitParams implicitMethodParams_00;
  ImplicitParams implicitMethodParams_01;
  ImplicitParams implicitMethodParams_02;
  uint64_t startingScopeId;
  long lVar5;
  Reader name_00;
  undefined8 uVar6;
  long *plVar7;
  NullableValue<capnp::compiler::BrandedDecl> *pNVar8;
  undefined4 uVar9;
  BrandedDecl *pBVar10;
  BrandedDecl *pBVar11;
  size_t sVar12;
  uint uVar13;
  undefined4 uVar14;
  _ _Var15;
  int iVar16;
  SegmentReader *pSVar17;
  BrandScope *pBVar18;
  CapTableReader *pCVar19;
  WirePointer *pWVar20;
  ArrayPtr<const_char> *params_1;
  undefined1 auVar21 [8];
  char *pcVar22;
  int *piVar23;
  ulong uVar24;
  ArrayPtr<const_char> *__n;
  WirePointer *pWVar25;
  uint uVar26;
  ElementCount EVar27;
  ulong uVar28;
  Disposer *pDVar29;
  SegmentReader *pSVar30;
  BrandedDecl *pBVar31;
  ElementCount EVar32;
  CapTableReader *pCVar33;
  undefined1 uVar34;
  Refcounted *refcounted;
  bool bVar35;
  bool bVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  int iVar42;
  undefined4 uVar43;
  int iVar44;
  undefined4 uVar45;
  int iVar46;
  Reader RVar47;
  StringPtr memberName;
  Reader name;
  Reader param;
  ArrayBuilder<capnp::compiler::BrandedDecl> compiledParams;
  Reader name_2;
  undefined8 local_528;
  undefined4 in_stack_fffffffffffffae4;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 uVar48;
  undefined4 in_stack_fffffffffffffaec;
  undefined4 uVar49;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 uVar50;
  undefined4 in_stack_fffffffffffffaf4;
  undefined4 uVar51;
  undefined4 in_stack_fffffffffffffaf8;
  undefined2 in_stack_fffffffffffffafc;
  undefined2 in_stack_fffffffffffffafe;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  undefined1 in_stack_fffffffffffffb08;
  undefined7 in_stack_fffffffffffffb09;
  undefined1 local_4f0;
  undefined3 uStack_4ef;
  undefined4 uStack_4ec;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  BrandScope *pBStack_4b8;
  undefined8 local_4b0;
  uint uStack_4a8;
  undefined4 uStack_4a4;
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  StructDataBitCount local_490;
  undefined4 uStack_48c;
  StructDataBitCount SStack_488;
  undefined4 uStack_484;
  ulong local_478;
  undefined1 local_468 [8];
  undefined1 auStack_460 [168];
  Disposer *local_3b8;
  BrandScope *pBStack_3b0;
  undefined1 local_3a8 [8];
  undefined8 uStack_3a0;
  WirePointer *local_398;
  uint local_390;
  BitsPerElementN<23> BStack_38c;
  uint local_388;
  StructPointerCount local_384;
  int local_380;
  undefined1 local_378 [12];
  undefined4 uStack_36c;
  undefined8 local_368;
  WirePointer *pWStack_360;
  uint local_358;
  StructPointerCount SStack_354;
  int iStack_350;
  undefined4 uStack_34c;
  BrandedDecl *local_348;
  BrandedDecl *pBStack_340;
  BrandedDecl *local_338;
  ArrayDisposer *local_330;
  String local_328;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  StructDataBitCount local_308;
  undefined4 uStack_304;
  int iStack_300;
  SegmentReader *local_2f0;
  NullableValue<capnp::compiler::BrandedDecl> local_2e8;
  Array<capnp::compiler::BrandedDecl> local_238;
  undefined4 local_218;
  undefined4 local_214;
  int local_210;
  undefined8 local_208;
  undefined4 local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  uint uStack_1ec;
  undefined4 local_1e8;
  undefined4 local_1d8;
  undefined4 local_1d4;
  int local_1d0;
  uint64_t local_1c8;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined8 local_1a8;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  PointerReader local_148;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  StructReader local_f0;
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  if (source._reader.dataSize < 0x10) goto switchD_003e2c56_caseD_0;
  puVar4 = (undefined2 *)source._reader.data;
  pSVar17 = source._reader.segment;
  pCVar33 = source._reader.capTable;
  pWVar20 = source._reader.pointers;
  switch(*puVar4) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 6:
  case 7:
  case 8:
  case 0xd:
    uVar24 = 0;
    if (source._reader.dataSize < 0x40) {
      uVar28 = 0;
    }
    else {
      uVar28 = (ulong)*(uint *)(puVar4 + 2);
      if (0x9f < source._reader.dataSize) {
        uVar24 = (ulong)*(uint *)(puVar4 + 8);
      }
    }
    (**this->errorReporter->_vptr_ErrorReporter)
              (this->errorReporter,uVar28,uVar24,"Expected name.",0xf);
  case 0:
switchD_003e2c56_caseD_0:
    (__return_storage_ptr__->ptr).isSet = false;
    return __return_storage_ptr__;
  case 5:
    uVar39 = 0;
    uVar38 = 0;
    if (source._reader.pointerCount != 0) {
      uVar39 = source._reader.segment._0_4_;
      uVar38 = source._reader.segment._4_4_;
    }
    local_528 = (char *)CONCAT44(uVar38,uVar39);
    local_3b8 = (Disposer *)resolver;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_2e8,(PointerReader *)&local_528,(word *)0x0);
    uVar39 = 0x7fffffff;
    uVar38 = 0;
    uVar41 = 0;
    if (local_2e8.field_1._28_2_ != 0) {
      uVar39 = local_2e8.field_1._32_4_;
      uVar38 = local_2e8.field_1._16_4_;
      uVar41 = local_2e8.field_1._20_4_;
    }
    uVar37._0_1_ = false;
    uVar37._1_3_ = 0;
    uVar40 = 0;
    uVar43 = 0;
    uVar45 = 0;
    if (local_2e8.field_1._28_2_ != 0) {
      uVar37 = local_2e8._0_4_;
      uVar40 = local_2e8._4_4_;
      uVar43 = local_2e8.field_1.value.body.tag;
      uVar45 = local_2e8.field_1._4_4_;
    }
    local_528 = (char *)CONCAT44(uVar40,uVar37);
    RVar47 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_528,(void *)0x0,0);
    __n = RVar47.super_StringPtr.content.size_;
    pSVar17 = RVar47.super_StringPtr.content.ptr;
    uVar24 = (ulong)implicitMethodParams.params.reader.elementCount;
    if (uVar24 != 0) {
      uVar28 = 0;
      do {
        EVar27 = (ElementCount)uVar28;
        capnp::_::ListReader::getStructElement
                  ((StructReader *)&local_528,&implicitMethodParams.params.reader,EVar27);
        auStack_460._16_4_ = in_stack_fffffffffffffb00;
        auStack_460._12_4_ = in_stack_fffffffffffffaf4;
        auStack_460._8_4_ = uVar39;
        if (in_stack_fffffffffffffafc == 0) {
          auStack_460._8_4_ = 0;
          auStack_460._12_4_ = 0;
          auStack_460._16_4_ = 0x7fffffff;
        }
        local_468._0_4_ = 0;
        local_468._4_4_ = 0;
        auStack_460._0_4_ = 0;
        auStack_460._4_4_ = 0;
        if (in_stack_fffffffffffffafc != 0) {
          local_468._0_4_ = (uint)local_528;
          local_468._4_4_ = local_528._4_4_;
          auStack_460._0_4_ = uVar43;
          auStack_460._4_4_ = uVar45;
        }
        RVar47 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)local_468,(void *)0x0,0);
        if ((RVar47.super_StringPtr.content.size_ == __n) &&
           ((__n == (ArrayPtr<const_char> *)0x0 ||
            (iVar16 = bcmp(RVar47.super_StringPtr.content.ptr,pSVar17,(size_t)__n), iVar16 == 0))))
        {
          if (implicitMethodParams.scopeId == 0) {
            (__return_storage_ptr__->ptr).field_1.value.source._reader.data = (void *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers = (WirePointer *)0x0
            ;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
                 (SegmentReader *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
                 (CapTableReader *)0x0;
            pNVar8 = &__return_storage_ptr__->ptr;
            *(StructDataBitCount *)((long)&pNVar8->field_1 + 0x98) = 0;
            *(StructPointerCount *)((long)&pNVar8->field_1 + 0x9c) = 0;
            *(undefined2 *)((long)&pNVar8->field_1 + 0x9e) = 0;
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.body.tag = 2;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0;
            *(ElementCount *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 8) =
                 EVar27;
          }
          else {
            (__return_storage_ptr__->ptr).field_1.value.source._reader.data = (void *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers = (WirePointer *)0x0
            ;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
                 (SegmentReader *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
                 (CapTableReader *)0x0;
            pNVar8 = &__return_storage_ptr__->ptr;
            *(StructDataBitCount *)((long)&pNVar8->field_1 + 0x98) = 0;
            *(StructPointerCount *)((long)&pNVar8->field_1 + 0x9c) = 0;
            *(undefined2 *)((long)&pNVar8->field_1 + 0x9e) = 0;
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.body.tag = 2;
            *(uint64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 implicitMethodParams.scopeId;
            *(ElementCount *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 8) =
                 EVar27 & 0xffff;
          }
          (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)0x0;
          (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)0x0;
          *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
               0x7fffffff;
          return __return_storage_ptr__;
        }
        uVar28 = uVar28 + 1;
      } while (uVar24 != uVar28);
    }
    pDVar29 = local_3b8;
    params_1 = __n;
    (**local_3b8->_vptr_Disposer)(&local_528,local_3b8,pSVar17);
    local_468[0] = local_528._0_1_;
    if (local_528._0_1_ != (_)0x1) {
      pEVar3 = this->errorReporter;
      local_3a8 = (undefined1  [8])0x582ce8;
      uStack_3a0 = (CapTableReader *)&DAT_0000000d;
      register0x000000a8 = (CapTableReader *)((long)&__n[-1].size_ + 7);
      local_378._0_8_ = pSVar17;
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)&local_528,(_ *)local_3a8,(ArrayPtr<const_char> *)local_378,params_1);
      lVar5 = CONCAT44(uVar45,uVar43);
      pSVar17 = (SegmentReader *)local_528;
      if (lVar5 == 0) {
        pSVar17 = (SegmentReader *)0x524569;
      }
      uVar24 = 0;
      if ((uint)local_2e8.field_1._24_4_ < 0x20) {
        uVar28 = 0;
      }
      else {
        uVar28 = (ulong)*(uint *)CONCAT17(local_2e8.field_1._15_1_,local_2e8.field_1._8_7_);
        if (0x3f < (uint)local_2e8.field_1._24_4_) {
          uVar24 = (ulong)((uint *)CONCAT17(local_2e8.field_1._15_1_,local_2e8.field_1._8_7_))[1];
        }
      }
      (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar28,uVar24,pSVar17,lVar5 + (ulong)(lVar5 == 0));
      pSVar17 = (SegmentReader *)local_528;
      if ((SegmentReader *)local_528 != (SegmentReader *)0x0) {
        local_528 = (char *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uVar41,uVar38))
                  ((undefined8 *)CONCAT44(uVar41,uVar38),pSVar17,1,CONCAT44(uVar45,uVar43),
                   CONCAT44(uVar45,uVar43),0);
      }
      goto switchD_003e2c56_caseD_0;
    }
    uVar37 = uVar38;
    uVar40 = uVar41;
    uVar14 = uVar39;
    if ((uVar43 != 2) &&
       (uVar37 = auStack_460._8_4_, uVar40 = auStack_460._12_4_, uVar14 = auStack_460._16_4_,
       uVar43 == 1)) {
      auStack_460._40_7_ = (undefined7)CONCAT71(in_stack_fffffffffffffb09,in_stack_fffffffffffffb08)
      ;
      auStack_460[0x2f] = (undefined1)((uint7)in_stack_fffffffffffffb09 >> 0x30);
      auStack_460._28_4_ =
           (undefined4)
           (CONCAT26(in_stack_fffffffffffffafe,
                     CONCAT24(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8)) >> 0x20);
      auStack_460._32_7_ = (undefined7)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00)
      ;
      auStack_460[0x27] = (undefined1)((uint)in_stack_fffffffffffffb04 >> 0x18);
      auStack_460[0x30] = local_4f0;
      uVar37 = uVar38;
      uVar40 = uVar41;
      uVar14 = uVar39;
    }
    auStack_460._16_4_ = uVar14;
    auStack_460._12_4_ = uVar40;
    auStack_460._8_4_ = uVar37;
    auStack_460._0_4_ = uVar43;
    interpretResolve((BrandedDecl *)&local_528,this,(Resolver *)pDVar29,(ResolveResult *)auStack_460
                     ,source);
    if (auStack_460._0_4_ == 1) {
      if (source._reader.dataSize < 0x40) {
        local_198 = 0;
        local_194 = 0;
      }
      else {
        local_198 = *(undefined4 *)(puVar4 + 2);
        local_194 = 0;
        if (0x9f < source._reader.dataSize) {
          local_194 = *(undefined4 *)(puVar4 + 8);
        }
      }
      local_188 = CONCAT44(auStack_460._12_4_,auStack_460._8_4_);
      local_190 = 1;
      (*this->errorReporter->_vptr_ErrorReporter[2])();
    }
    break;
  case 9:
    pCVar19 = pCVar33;
    pWVar25 = pWVar20;
    pSVar30 = pSVar17;
    local_2e8.field_1._16_4_ = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      pCVar19 = (CapTableReader *)0x0;
      pWVar25 = (WirePointer *)0x0;
      pSVar30 = (SegmentReader *)0x0;
      local_2e8.field_1._16_4_ = 0x7fffffff;
    }
    local_2e8._0_4_ = SUB84(pSVar30,0);
    local_2e8._4_4_ = SUB84((ulong)pSVar30 >> 0x20,0);
    local_2e8.field_1.value.body.tag = (uint)pCVar19;
    local_2e8.field_1._4_4_ = (undefined4)((ulong)pCVar19 >> 0x20);
    local_2e8.field_1._8_7_ = SUB87(pWVar25,0);
    local_2e8.field_1._15_1_ = (undefined1)((ulong)pWVar25 >> 0x38);
    local_3b8 = (Disposer *)resolver;
    capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)&local_2e8,(word *)0x0);
    implicitMethodParams_01.params.reader.step = implicitMethodParams.params.reader.step;
    implicitMethodParams_01.params.reader.elementCount =
         implicitMethodParams.params.reader.elementCount;
    source_01._reader.capTable = local_60.capTable;
    source_01._reader.segment = local_60.segment;
    source_01._reader.data = local_60.data;
    source_01._reader.pointers = local_60.pointers;
    source_01._reader.dataSize = local_60.dataSize;
    source_01._reader.pointerCount = local_60.pointerCount;
    source_01._reader._38_2_ = local_60._38_2_;
    source_01._reader.nestingLimit = local_60.nestingLimit;
    source_01._reader._44_4_ = local_60._44_4_;
    implicitMethodParams_01.params.reader.segment = implicitMethodParams.params.reader.segment;
    implicitMethodParams_01.scopeId = implicitMethodParams.scopeId;
    implicitMethodParams_01.params.reader.capTable = implicitMethodParams.params.reader.capTable;
    implicitMethodParams_01.params.reader.ptr = implicitMethodParams.params.reader.ptr;
    implicitMethodParams_01.params.reader.structDataSize =
         implicitMethodParams.params.reader.structDataSize;
    implicitMethodParams_01.params.reader.structPointerCount =
         implicitMethodParams.params.reader.structPointerCount;
    implicitMethodParams_01.params.reader.elementSize =
         implicitMethodParams.params.reader.elementSize;
    implicitMethodParams_01.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
    implicitMethodParams_01.params.reader.nestingLimit =
         implicitMethodParams.params.reader.nestingLimit;
    implicitMethodParams_01.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
    compileDeclExpression
              ((Maybe<capnp::compiler::BrandedDecl> *)local_468,this,source_01,(Resolver *)local_3b8
               ,implicitMethodParams_01);
    uVar9 = auStack_460._164_4_;
    uVar14 = auStack_460._160_4_;
    uVar40 = auStack_460._156_4_;
    uVar37 = auStack_460._152_4_;
    uVar45 = auStack_460._148_4_;
    uVar43 = auStack_460._144_4_;
    uVar41 = auStack_460._140_4_;
    uVar38 = auStack_460._136_4_;
    uVar6 = auStack_460._112_8_;
    uVar39 = auStack_460._0_4_;
    local_528 = (char *)CONCAT71(local_528._1_7_,local_468[0]);
    if (local_468[0] != (_)0x1) {
      (__return_storage_ptr__->ptr).isSet = false;
      _Var15 = local_468[0];
      goto LAB_003e4a77;
    }
    uVar48 = auStack_460._8_4_;
    uVar49 = auStack_460._12_4_;
    uVar50 = auStack_460._16_4_;
    uVar51 = auStack_460._20_4_;
    if ((auStack_460._0_4_ != 2) &&
       (uVar48 = in_stack_fffffffffffffae8, uVar49 = in_stack_fffffffffffffaec,
       uVar50 = in_stack_fffffffffffffaf0, uVar51 = in_stack_fffffffffffffaf4,
       auStack_460._0_4_ == 1)) {
      in_stack_fffffffffffffb08 = (undefined1)auStack_460._40_7_;
      in_stack_fffffffffffffb09 = (undefined7)(CONCAT17(auStack_460[0x2f],auStack_460._40_7_) >> 8);
      in_stack_fffffffffffffafc = (undefined2)auStack_460._28_4_;
      in_stack_fffffffffffffafe = SUB42(auStack_460._28_4_,2);
      in_stack_fffffffffffffb00 = (undefined4)auStack_460._32_7_;
      in_stack_fffffffffffffb04 =
           (undefined4)(CONCAT17(auStack_460[0x27],auStack_460._32_7_) >> 0x20);
      uStack_4ef = 0;
      local_4f0 = auStack_460[0x30];
      uVar48 = auStack_460._8_4_;
      uVar49 = auStack_460._12_4_;
      uVar50 = auStack_460._16_4_;
      uVar51 = auStack_460._20_4_;
      in_stack_fffffffffffffaf8 = auStack_460._24_4_;
      if (auStack_460[0x30] == 1) {
        uStack_4c8 = auStack_460._88_8_;
        local_4c0 = auStack_460._96_8_;
        uStack_4d8 = auStack_460._72_8_;
        local_4d0 = auStack_460._80_8_;
        uStack_4e8 = auStack_460._56_8_;
        local_4e0 = auStack_460._64_8_;
        auStack_460[0x30] = 0;
      }
    }
    pBStack_4b8 = (BrandScope *)CONCAT44(auStack_460._108_4_,auStack_460._104_4_);
    pSVar30 = (SegmentReader *)CONCAT44(auStack_460._124_4_,auStack_460._120_4_);
    pCVar19 = (CapTableReader *)CONCAT44(auStack_460._132_4_,auStack_460._128_4_);
    local_4b0 = (BrandScope *)auStack_460._112_8_;
    if (source._reader.pointerCount < 2) {
      auStack_460._16_4_ = 0x7fffffff;
      pCVar33 = (CapTableReader *)0x0;
      pWVar20 = (WirePointer *)0x0;
      pSVar17 = (SegmentReader *)0x0;
    }
    else {
      pWVar20 = pWVar20 + 1;
      auStack_460._16_4_ = source._reader.nestingLimit;
    }
    local_468._0_4_ = SUB84(pSVar17,0);
    local_468._4_4_ = (undefined4)((ulong)pSVar17 >> 0x20);
    auStack_460._0_4_ = SUB84(pCVar33,0);
    auStack_460._4_4_ = (undefined4)((ulong)pCVar33 >> 0x20);
    auStack_460._8_4_ = SUB84(pWVar20,0);
    auStack_460._12_4_ = (undefined4)((ulong)pWVar20 >> 0x20);
    capnp::_::PointerReader::getList
              ((ListReader *)local_3a8,(PointerReader *)local_468,INLINE_COMPOSITE,(word *)0x0);
    pBVar18 = (BrandScope *)(ulong)local_390;
    pBStack_340 = (BrandedDecl *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (0xa8,0,(size_t)pBVar18,(_func_void_void_ptr *)0x0,
                             (_func_void_void_ptr *)0x0);
    local_338 = pBStack_340 + (long)pBVar18;
    local_330 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    pBVar31 = pBStack_340;
    if (local_390 == 0) {
LAB_003e46aa:
      uVar34 = SUB81(pCVar33,0);
      local_238.size_ = ((long)pBStack_340 - (long)pBVar31 >> 3) * -0x30c30c30c30c30c3;
      local_348 = (BrandedDecl *)0x0;
      pBStack_340 = (BrandedDecl *)0x0;
      local_338 = (BrandedDecl *)0x0;
      local_238.ptr = pBVar31;
      local_238.disposer = local_330;
      BrandedDecl::applyParams
                ((Maybe<capnp::compiler::BrandedDecl> *)local_468,
                 (BrandedDecl *)&stack0xfffffffffffffae0,&local_238,source);
      sVar12 = local_238.size_;
      pBVar31 = local_238.ptr;
      bVar35 = (bool)local_468[0];
      uVar26 = (uint)pBVar18;
      uVar13 = auStack_460._0_4_;
      if (local_468[0] == (_)0x1) {
        if (auStack_460._0_4_ == 2) {
          local_328.content.ptr._4_4_ = auStack_460._8_4_;
          local_328.content.size_._0_4_ = auStack_460._12_4_;
          local_328.content.size_._4_4_ = auStack_460._16_4_;
          local_328.content.disposer._0_4_ = auStack_460._20_4_;
        }
        else if (auStack_460._0_4_ == 1) {
          uStack_304 = (undefined4)auStack_460._40_7_;
          iStack_300 = (int)(CONCAT17(auStack_460[0x2f],auStack_460._40_7_) >> 0x20);
          local_328.content.disposer._4_4_ = auStack_460._24_4_;
          uStack_310 = auStack_460._28_4_;
          uStack_30c = (undefined4)auStack_460._32_7_;
          local_308 = (StructDataBitCount)(CONCAT17(auStack_460[0x27],auStack_460._32_7_) >> 0x20);
          local_328.content.ptr._4_4_ = auStack_460._8_4_;
          local_328.content.size_._0_4_ = auStack_460._12_4_;
          local_328.content.size_._4_4_ = auStack_460._16_4_;
          local_328.content.disposer._0_4_ = auStack_460._20_4_;
          uVar34 = auStack_460[0x30];
          if (auStack_460[0x30] == 1) {
            local_2e8.field_1._31_1_ = (undefined1)auStack_460._88_8_;
            local_2e8.field_1._32_4_ = SUB84(auStack_460._88_8_,1);
            local_2e8.field_1._36_3_ = SUB83(auStack_460._88_8_,5);
            local_2e8.field_1._39_1_ = (undefined1)auStack_460._96_8_;
            local_2e8.field_1._40_7_ = SUB87(auStack_460._96_8_,1);
            local_2e8.field_1._15_1_ = (undefined1)auStack_460._72_8_;
            local_2e8.field_1._16_4_ = SUB84(auStack_460._72_8_,1);
            local_2e8.field_1._20_3_ = SUB83(auStack_460._72_8_,5);
            local_2e8.field_1._23_1_ = (undefined1)auStack_460._80_8_;
            local_2e8.field_1._24_4_ = SUB84(auStack_460._80_8_,1);
            local_2e8.field_1._28_2_ = SUB82(auStack_460._80_8_,5);
            local_2e8.field_1._30_1_ = SUB81(auStack_460._80_8_,7);
            local_2e8._7_1_ = SUB81(auStack_460._56_8_,0);
            local_2e8.field_1.value.body.tag = SUB84(auStack_460._56_8_,1);
            local_2e8.field_1._4_3_ = SUB83(auStack_460._56_8_,5);
            local_2e8.field_1._7_1_ = (undefined1)auStack_460._64_8_;
            local_2e8.field_1._8_7_ = SUB87(auStack_460._64_8_,1);
            auStack_460[0x30] = 0;
          }
        }
        local_3b8 = (Disposer *)CONCAT44(auStack_460._108_4_,auStack_460._104_4_);
        pBStack_3b0 = (BrandScope *)auStack_460._112_8_;
        local_378._0_8_ = CONCAT44(auStack_460._124_4_,auStack_460._120_4_);
        unique0x10005029 = (CapTableReader *)CONCAT44(auStack_460._132_4_,auStack_460._128_4_);
        local_368 = (WirePointer *)CONCAT44(auStack_460._140_4_,auStack_460._136_4_);
        pWStack_360 = (WirePointer *)CONCAT44(auStack_460._148_4_,auStack_460._144_4_);
        _SStack_354 = auStack_460._156_4_;
        local_358 = auStack_460._152_4_;
        uStack_34c = auStack_460._164_4_;
        iStack_350 = auStack_460._160_4_;
        auStack_460._112_8_ = (BrandScope *)0x0;
        uVar26 = auStack_460._0_4_;
        uVar13 = 0;
        if (1 < auStack_460._0_4_ - 1) {
          uVar13 = auStack_460._0_4_;
        }
      }
      auStack_460._0_4_ = uVar13;
      if (local_238.ptr != (BrandedDecl *)0x0) {
        local_238.ptr = (BrandedDecl *)0x0;
        local_238.size_ = 0;
        (**(local_238.disposer)->_vptr_ArrayDisposer)
                  (local_238.disposer,pBVar31,0xa8,sVar12,sVar12,
                   kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
      }
      (__return_storage_ptr__->ptr).isSet = true;
      if (bVar35 == false) {
        (__return_storage_ptr__->ptr).field_1.value.body.tag = uVar39;
        if (uVar39 == 2) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar49,uVar48);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = CONCAT44(uVar51,uVar50);
        }
        else if (uVar39 == 1) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
               CONCAT71(in_stack_fffffffffffffb09,in_stack_fffffffffffffb08);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
               CONCAT26(in_stack_fffffffffffffafe,
                        CONCAT24(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
               CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar49,uVar48);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = CONCAT44(uVar51,uVar50);
          *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_4f0;
          if (local_4f0 == '\x01') {
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = uStack_4c8;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_4c0;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = uStack_4d8;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = local_4d0;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = uStack_4e8;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = local_4e0;
          }
        }
        (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)pBStack_4b8;
        (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)uVar6;
        local_4b0 = (BrandScope *)0x0;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) = uVar37;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) = uVar40;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = uVar14;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) = uVar9;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) = uVar38;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) = uVar41;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) = uVar43;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) = uVar45;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.segment = pSVar30;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable = pCVar19;
      }
      else {
        (__return_storage_ptr__->ptr).field_1.value.body.tag = uVar26;
        if (uVar26 == 2) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
               CONCAT44((int)local_328.content.size_,local_328.content.ptr._4_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44((int)local_328.content.disposer,local_328.content.size_._4_4_);
        }
        else if (uVar26 == 1) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
               CONCAT44(iStack_300,uStack_304);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
               CONCAT44(uStack_310,local_328.content.disposer._4_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
               CONCAT44(local_308,uStack_30c);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
               CONCAT44((int)local_328.content.size_,local_328.content.ptr._4_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44((int)local_328.content.disposer,local_328.content.size_._4_4_);
          *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = uVar34;
          if ((uVar34 & 1) != 0) {
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
                 CONCAT35(local_2e8.field_1._36_3_,
                          CONCAT41(local_2e8.field_1._32_4_,local_2e8.field_1._31_1_));
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) =
                 CONCAT71(local_2e8.field_1._40_7_,local_2e8.field_1._39_1_);
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
                 CONCAT35(local_2e8.field_1._20_3_,
                          CONCAT41(local_2e8.field_1._16_4_,local_2e8.field_1._15_1_));
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
                 CONCAT17(local_2e8.field_1._30_1_,
                          CONCAT25(local_2e8.field_1._28_2_,
                                   CONCAT41(local_2e8.field_1._24_4_,local_2e8.field_1._23_1_)));
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
                 CONCAT35(local_2e8.field_1._4_3_,
                          CONCAT41(local_2e8.field_1.value.body.tag,local_2e8._7_1_));
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
                 CONCAT71(local_2e8.field_1._8_7_,local_2e8.field_1._7_1_);
          }
        }
        (__return_storage_ptr__->ptr).field_1.value.brand.disposer = local_3b8;
        (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBStack_3b0;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
             (SegmentReader *)local_378._0_8_;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
             stack0xfffffffffffffc90;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) = (undefined4)local_368
        ;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) = local_368._4_4_;
        *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) = (int)pWStack_360;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) = pWStack_360._4_4_;
        *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) = local_358;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) = _SStack_354;
        *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = iStack_350;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) = uStack_34c;
      }
    }
    else {
      local_478 = (ulong)pBStack_340 & 0xffffffff;
      bVar35 = false;
      pDVar29 = local_3b8;
      EVar27 = 0;
      local_348 = pBStack_340;
      do {
        while( true ) {
          EVar32 = EVar27 + 1;
          capnp::_::ListReader::getStructElement
                    ((StructReader *)local_378,(ListReader *)local_3a8,EVar27);
          if ((0xf < local_358) && ((short)(local_368->offsetAndKind).value == 1)) {
            bVar36 = SStack_354 == 0;
            pWVar20 = pWStack_360;
            if (bVar36) {
              pWVar20 = (WirePointer *)0x0;
            }
            local_2e8.field_1._16_4_ = iStack_350;
            if (bVar36) {
              local_2e8.field_1._16_4_ = 0x7fffffff;
            }
            local_2e8.isSet = false;
            local_2e8._1_3_ = 0;
            local_2e8._4_4_ = 0;
            local_2e8.field_1.value.body.tag = 0;
            local_2e8.field_1._4_4_ = 0;
            if (!bVar36) {
              local_2e8._0_4_ = local_378._0_4_;
              local_2e8._4_4_ = local_378._4_4_;
              local_2e8.field_1.value.body.tag = local_378._8_4_;
              local_2e8.field_1._4_4_ = uStack_36c;
            }
            pEVar3 = this->errorReporter;
            local_2e8.field_1._8_7_ = SUB87(pWVar20,0);
            local_2e8.field_1._15_1_ = (undefined1)((ulong)pWVar20 >> 0x38);
            capnp::_::PointerReader::getStruct
                      ((StructReader *)local_468,(PointerReader *)&local_2e8,(word *)0x0);
            uVar24 = 0;
            if ((uint)auStack_460._24_4_ < 0x20) {
              uVar28 = 0;
            }
            else {
              uVar28 = (ulong)*(uint *)CONCAT44(auStack_460._12_4_,auStack_460._8_4_);
              if (0x3f < (uint)auStack_460._24_4_) {
                uVar24 = (ulong)((uint *)CONCAT44(auStack_460._12_4_,auStack_460._8_4_))[1];
              }
            }
            (**pEVar3->_vptr_ErrorReporter)
                      (pEVar3,uVar28,uVar24,"Named parameter not allowed here.",0x22);
            pDVar29 = local_3b8;
          }
          local_148.pointer = pWStack_360 + 1;
          if (SStack_354 < 2) {
            local_148.pointer = (WirePointer *)0x0;
          }
          if (SStack_354 < 2) {
            local_148.segment._0_4_ = 0;
            local_148.segment._4_4_ = 0;
            local_148.capTable._0_4_ = 0;
            local_148.capTable._4_4_ = 0;
            local_148.nestingLimit = 0x7fffffff;
          }
          else {
            local_148.segment._0_4_ = local_378._0_4_;
            local_148.segment._4_4_ = local_378._4_4_;
            local_148.capTable._0_4_ = local_378._8_4_;
            local_148.capTable._4_4_ = uStack_36c;
            local_148.nestingLimit = iStack_350;
          }
          capnp::_::PointerReader::getStruct(&local_c0,&local_148,(word *)0x0);
          implicitMethodParams_02.params.reader.step = implicitMethodParams.params.reader.step;
          implicitMethodParams_02.params.reader.elementCount =
               implicitMethodParams.params.reader.elementCount;
          source_02._reader.capTable = local_c0.capTable;
          source_02._reader.segment = local_c0.segment;
          source_02._reader.data = local_c0.data;
          source_02._reader.pointers = local_c0.pointers;
          source_02._reader.dataSize = local_c0.dataSize;
          source_02._reader.pointerCount = local_c0.pointerCount;
          source_02._reader._38_2_ = local_c0._38_2_;
          source_02._reader.nestingLimit = local_c0.nestingLimit;
          source_02._reader._44_4_ = local_c0._44_4_;
          implicitMethodParams_02.params.reader.segment = implicitMethodParams.params.reader.segment
          ;
          implicitMethodParams_02.scopeId = implicitMethodParams.scopeId;
          implicitMethodParams_02.params.reader.capTable =
               implicitMethodParams.params.reader.capTable;
          implicitMethodParams_02.params.reader.ptr = implicitMethodParams.params.reader.ptr;
          implicitMethodParams_02.params.reader.structDataSize =
               implicitMethodParams.params.reader.structDataSize;
          implicitMethodParams_02.params.reader.structPointerCount =
               implicitMethodParams.params.reader.structPointerCount;
          implicitMethodParams_02.params.reader.elementSize =
               implicitMethodParams.params.reader.elementSize;
          implicitMethodParams_02.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
          implicitMethodParams_02.params.reader.nestingLimit =
               implicitMethodParams.params.reader.nestingLimit;
          implicitMethodParams_02.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
          compileDeclExpression
                    ((Maybe<capnp::compiler::BrandedDecl> *)local_468,this,source_02,
                     (Resolver *)pDVar29,implicitMethodParams_02);
          EVar27 = EVar32;
          if (local_468[0] == (_)0x1) break;
          bVar35 = true;
          if (EVar32 == local_390) goto LAB_003e4002;
        }
        if (auStack_460._0_4_ == 2) {
          piVar23 = (int *)&local_118;
          iVar16 = auStack_460._8_4_;
          iVar42 = auStack_460._12_4_;
          iVar44 = auStack_460._16_4_;
          iVar46 = auStack_460._20_4_;
LAB_003e3ef9:
          *piVar23 = iVar16;
          piVar23[1] = iVar42;
          piVar23[2] = iVar44;
          piVar23[3] = iVar46;
        }
        else if (auStack_460._0_4_ == 1) {
          local_f8 = CONCAT17(auStack_460[0x2f],auStack_460._40_7_);
          local_118 = CONCAT44(auStack_460._12_4_,auStack_460._8_4_);
          uStack_110 = CONCAT44(auStack_460._20_4_,auStack_460._16_4_);
          local_108 = CONCAT44(auStack_460._28_4_,auStack_460._24_4_);
          uStack_100 = CONCAT17(auStack_460[0x27],auStack_460._32_7_);
          local_478 = (ulong)(byte)auStack_460[0x30];
          if (auStack_460[0x30] == 1) {
            piVar23 = (int *)&local_2e8.field_0x7;
            local_2e8.field_1._31_1_ = (undefined1)auStack_460._88_8_;
            local_2e8.field_1._32_4_ = SUB84(auStack_460._88_8_,1);
            local_2e8.field_1._36_3_ = SUB83(auStack_460._88_8_,5);
            local_2e8.field_1._39_1_ = (undefined1)auStack_460._96_8_;
            local_2e8.field_1._40_7_ = SUB87(auStack_460._96_8_,1);
            local_2e8.field_1._15_1_ = (undefined1)auStack_460._72_8_;
            local_2e8.field_1._16_4_ = SUB84(auStack_460._72_8_,1);
            local_2e8.field_1._20_3_ = SUB83(auStack_460._72_8_,5);
            local_2e8.field_1._23_1_ = (undefined1)auStack_460._80_8_;
            local_2e8.field_1._24_4_ = SUB84(auStack_460._80_8_,1);
            local_2e8.field_1._28_2_ = SUB82(auStack_460._80_8_,5);
            local_2e8.field_1._30_1_ = SUB81(auStack_460._80_8_,7);
            iVar16 = auStack_460._56_4_;
            iVar42 = auStack_460._60_4_;
            iVar44 = auStack_460._64_4_;
            iVar46 = auStack_460._68_4_;
            goto LAB_003e3ef9;
          }
        }
        local_328.content.ptr._4_4_ = auStack_460._124_4_;
        local_328.content.size_._0_4_ = auStack_460._128_4_;
        local_328.content.size_._4_4_ = auStack_460._132_4_;
        local_328.content.disposer._0_4_ = auStack_460._136_4_;
        local_328.content.disposer._4_4_ = auStack_460._140_4_;
        uStack_310 = auStack_460._144_4_;
        uStack_30c = auStack_460._148_4_;
        local_308 = auStack_460._152_4_;
        uStack_304 = auStack_460._156_4_;
        iStack_300 = auStack_460._160_4_;
        (pBStack_340->body).tag = auStack_460._0_4_;
        if (auStack_460._0_4_ - 1 < 2) {
          paVar2 = &(pBStack_340->body).field_1;
          if (auStack_460._0_4_ == 1) {
            *(undefined8 *)((long)&(pBStack_340->body).field_1 + 0x20) = local_f8;
            *(undefined8 *)((long)&(pBStack_340->body).field_1 + 0x10) = local_108;
            *(undefined8 *)((long)&(pBStack_340->body).field_1 + 0x18) = uStack_100;
            *(undefined8 *)paVar2 = local_118;
            *(undefined8 *)((long)&(pBStack_340->body).field_1 + 8) = uStack_110;
            (pBStack_340->body).field_1.space[0x28] = (byte)local_478;
            if ((local_478 & 1) != 0) {
              *(ulong *)((long)&(pBStack_340->body).field_1 + 0x50) =
                   CONCAT35(local_2e8.field_1._36_3_,
                            CONCAT41(local_2e8.field_1._32_4_,local_2e8.field_1._31_1_));
              *(ulong *)((long)&(pBStack_340->body).field_1 + 0x58) =
                   CONCAT71(local_2e8.field_1._40_7_,local_2e8.field_1._39_1_);
              *(ulong *)((long)&(pBStack_340->body).field_1 + 0x40) =
                   CONCAT35(local_2e8.field_1._20_3_,
                            CONCAT41(local_2e8.field_1._16_4_,local_2e8.field_1._15_1_));
              *(ulong *)((long)&(pBStack_340->body).field_1 + 0x48) =
                   CONCAT17(local_2e8.field_1._30_1_,
                            CONCAT25(local_2e8.field_1._28_2_,
                                     CONCAT41(local_2e8.field_1._24_4_,local_2e8.field_1._23_1_)));
              *(ulong *)((long)&(pBStack_340->body).field_1 + 0x30) =
                   CONCAT35(local_2e8.field_1._4_3_,
                            CONCAT41(local_2e8.field_1.value.body.tag,local_2e8._7_1_));
              *(ulong *)((long)&(pBStack_340->body).field_1 + 0x38) =
                   CONCAT71(local_2e8.field_1._8_7_,local_2e8.field_1._7_1_);
              local_478 = 0;
            }
          }
          else {
            *(undefined8 *)paVar2 = local_118;
            *(undefined8 *)((long)&(pBStack_340->body).field_1 + 8) = uStack_110;
          }
        }
        (pBStack_340->brand).disposer =
             (Disposer *)CONCAT44(auStack_460._108_4_,auStack_460._104_4_);
        (pBStack_340->brand).ptr = (BrandScope *)auStack_460._112_8_;
        (pBStack_340->source)._reader.segment =
             (SegmentReader *)CONCAT44(auStack_460._124_4_,auStack_460._120_4_);
        (pBStack_340->source)._reader.capTable =
             (CapTableReader *)CONCAT44(auStack_460._132_4_,auStack_460._128_4_);
        (pBStack_340->source)._reader.data =
             (void *)CONCAT44(auStack_460._140_4_,auStack_460._136_4_);
        (pBStack_340->source)._reader.pointers =
             (WirePointer *)CONCAT44(auStack_460._148_4_,auStack_460._144_4_);
        (pBStack_340->source)._reader.dataSize = auStack_460._152_4_;
        (pBStack_340->source)._reader.pointerCount = (short)auStack_460._156_4_;
        *(short *)&(pBStack_340->source)._reader.field_0x26 = SUB42(auStack_460._156_4_,2);
        *(ulong *)&(pBStack_340->source)._reader.nestingLimit =
             CONCAT44(auStack_460._164_4_,auStack_460._160_4_);
        pBStack_340 = pBStack_340 + 1;
      } while (EVar32 != local_390);
      if (!bVar35) {
        pCVar33 = (CapTableReader *)0x0;
        pBVar18 = this;
        pBVar31 = local_348;
        goto LAB_003e46aa;
      }
LAB_003e4002:
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = uVar39;
      if (uVar39 == 2) {
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar49,uVar48);
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = CONCAT44(uVar51,uVar50);
      }
      else if (uVar39 == 1) {
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
             CONCAT71(in_stack_fffffffffffffb09,in_stack_fffffffffffffb08);
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
             CONCAT26(in_stack_fffffffffffffafe,
                      CONCAT24(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
             CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00);
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar49,uVar48);
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = CONCAT44(uVar51,uVar50);
        *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_4f0;
        if (local_4f0 == '\x01') {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = uStack_4c8;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_4c0;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = uStack_4d8;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = local_4d0;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = uStack_4e8;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = local_4e0;
        }
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)pBStack_4b8;
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)uVar6;
      local_4b0 = (BrandScope *)0x0;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) = uVar37;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) = uVar40;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = uVar14;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) = uVar9;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) = uVar38;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) = uVar41;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) = uVar43;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) = uVar45;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.segment = pSVar30;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable = pCVar19;
    }
    pBVar11 = local_338;
    pBVar10 = pBStack_340;
    pBVar31 = local_348;
    if (local_348 != (BrandedDecl *)0x0) {
      local_348 = (BrandedDecl *)0x0;
      pBStack_340 = (BrandedDecl *)0x0;
      local_338 = (BrandedDecl *)0x0;
      (**local_330->_vptr_ArrayDisposer)
                (local_330,pBVar31,0xa8,((long)pBVar10 - (long)pBVar31 >> 3) * -0x30c30c30c30c30c3,
                 ((long)pBVar11 - (long)pBVar31 >> 3) * -0x30c30c30c30c30c3,
                 kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
    }
    _Var15 = local_528._0_1_;
LAB_003e4a77:
    if (((byte)_Var15 & 1) == 0) {
      return __return_storage_ptr__;
    }
    if (local_4b0 == (BrandScope *)0x0) {
      return __return_storage_ptr__;
    }
    (**(pBStack_4b8->super_Refcounted).super_Disposer._vptr_Disposer)
              (pBStack_4b8,
               (_func_int *)
               ((long)&(local_4b0->super_Refcounted).super_Disposer._vptr_Disposer +
               (long)(local_4b0->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
    return __return_storage_ptr__;
  case 10:
    local_3b8 = (Disposer *)CONCAT44(local_3b8._4_4_,source._reader.nestingLimit);
    pCVar19 = pCVar33;
    pWVar25 = pWVar20;
    pSVar30 = pSVar17;
    local_2e8.field_1._16_4_ = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      pCVar19 = (CapTableReader *)0x0;
      pWVar25 = (WirePointer *)0x0;
      pSVar30 = (SegmentReader *)0x0;
      local_2e8.field_1._16_4_ = 0x7fffffff;
    }
    local_2e8._0_4_ = SUB84(pSVar30,0);
    local_2e8._4_4_ = SUB84((ulong)pSVar30 >> 0x20,0);
    local_2e8.field_1.value.body.tag = (uint)pCVar19;
    local_2e8.field_1._4_4_ = (undefined4)((ulong)pCVar19 >> 0x20);
    local_2e8.field_1._8_7_ = SUB87(pWVar25,0);
    local_2e8.field_1._15_1_ = (undefined1)((ulong)pWVar25 >> 0x38);
    local_2f0 = pSVar17;
    capnp::_::PointerReader::getStruct(&local_90,(PointerReader *)&local_2e8,(word *)0x0);
    implicitMethodParams_00.params.reader.step = implicitMethodParams.params.reader.step;
    implicitMethodParams_00.params.reader.elementCount =
         implicitMethodParams.params.reader.elementCount;
    source_00._reader.capTable = local_90.capTable;
    source_00._reader.segment = local_90.segment;
    source_00._reader.data = local_90.data;
    source_00._reader.pointers = local_90.pointers;
    source_00._reader.dataSize = local_90.dataSize;
    source_00._reader.pointerCount = local_90.pointerCount;
    source_00._reader._38_2_ = local_90._38_2_;
    source_00._reader.nestingLimit = local_90.nestingLimit;
    source_00._reader._44_4_ = local_90._44_4_;
    implicitMethodParams_00.params.reader.segment = implicitMethodParams.params.reader.segment;
    implicitMethodParams_00.scopeId = implicitMethodParams.scopeId;
    implicitMethodParams_00.params.reader.capTable = implicitMethodParams.params.reader.capTable;
    implicitMethodParams_00.params.reader.ptr = implicitMethodParams.params.reader.ptr;
    implicitMethodParams_00.params.reader.structDataSize =
         implicitMethodParams.params.reader.structDataSize;
    implicitMethodParams_00.params.reader.structPointerCount =
         implicitMethodParams.params.reader.structPointerCount;
    implicitMethodParams_00.params.reader.elementSize =
         implicitMethodParams.params.reader.elementSize;
    implicitMethodParams_00.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
    implicitMethodParams_00.params.reader.nestingLimit =
         implicitMethodParams.params.reader.nestingLimit;
    implicitMethodParams_00.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
    compileDeclExpression
              ((Maybe<capnp::compiler::BrandedDecl> *)local_468,this,source_00,resolver,
               implicitMethodParams_00);
    uVar39 = auStack_460._0_4_;
    local_528 = (char *)CONCAT71(local_528._1_7_,local_468[0]);
    if (local_468[0] == (_)0x1) {
      uVar38 = auStack_460._8_4_;
      uVar41 = auStack_460._12_4_;
      uVar43 = auStack_460._16_4_;
      uVar45 = auStack_460._20_4_;
      if ((auStack_460._0_4_ != 2) &&
         (uVar38 = in_stack_fffffffffffffae8, uVar41 = in_stack_fffffffffffffaec,
         uVar43 = in_stack_fffffffffffffaf0, uVar45 = in_stack_fffffffffffffaf4,
         auStack_460._0_4_ == 1)) {
        in_stack_fffffffffffffb08 = (undefined1)auStack_460._40_7_;
        in_stack_fffffffffffffb09 =
             (undefined7)(CONCAT17(auStack_460[0x2f],auStack_460._40_7_) >> 8);
        in_stack_fffffffffffffafc = (undefined2)auStack_460._28_4_;
        in_stack_fffffffffffffafe = SUB42(auStack_460._28_4_,2);
        in_stack_fffffffffffffb00 = (undefined4)auStack_460._32_7_;
        in_stack_fffffffffffffb04 =
             (undefined4)(CONCAT17(auStack_460[0x27],auStack_460._32_7_) >> 0x20);
        uVar38 = auStack_460._8_4_;
        uVar41 = auStack_460._12_4_;
        uVar43 = auStack_460._16_4_;
        uVar45 = auStack_460._20_4_;
        in_stack_fffffffffffffaf8 = auStack_460._24_4_;
        if (auStack_460[0x30] == 1) {
          auStack_460[0x30] = 0;
        }
      }
      pBStack_4b8 = (BrandScope *)CONCAT44(auStack_460._108_4_,auStack_460._104_4_);
      local_4b0 = (BrandScope *)auStack_460._112_8_;
      if (source._reader.pointerCount < 2) {
        auStack_460._16_4_ = 0x7fffffff;
        pCVar19 = (CapTableReader *)0x0;
        pWVar25 = (WirePointer *)0x0;
        pSVar17 = (SegmentReader *)0x0;
      }
      else {
        pWVar25 = pWVar20 + 1;
        pCVar19 = pCVar33;
        pSVar17 = local_2f0;
        auStack_460._16_4_ = (int)local_3b8;
      }
      local_468._0_4_ = SUB84(pSVar17,0);
      local_468._4_4_ = (undefined4)((ulong)pSVar17 >> 0x20);
      auStack_460._0_4_ = SUB84(pCVar19,0);
      auStack_460._4_4_ = (undefined4)((ulong)pCVar19 >> 0x20);
      auStack_460._8_4_ = SUB84(pWVar25,0);
      auStack_460._12_4_ = (undefined4)((ulong)pWVar25 >> 0x20);
      capnp::_::PointerReader::getStruct
                ((StructReader *)local_3a8,(PointerReader *)local_468,(word *)0x0);
      bVar35 = local_384 == 0;
      local_368 = (WirePointer *)CONCAT44(BStack_38c,local_390);
      if (bVar35) {
        local_368 = (WirePointer *)0x0;
      }
      iVar16 = 0x7fffffff;
      if (!bVar35) {
        iVar16 = local_380;
      }
      local_378._0_4_ = 0;
      local_378._4_4_ = 0;
      uVar37 = 0;
      uVar40 = 0;
      if (!bVar35) {
        local_378._0_4_ = local_3a8._0_4_;
        local_378._4_4_ = local_3a8._4_4_;
        uVar37 = (undefined4)uStack_3a0;
        uVar40 = uStack_3a0._4_4_;
      }
      stack0xfffffffffffffc90 = (CapTableReader *)CONCAT44(uVar40,uVar37);
      pWStack_360 = (WirePointer *)CONCAT44(pWStack_360._4_4_,iVar16);
      memberName.content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_378,(void *)0x0,0);
      BrandedDecl::getMember
                ((Maybe<capnp::compiler::BrandedDecl> *)&local_2e8,
                 (BrandedDecl *)&stack0xfffffffffffffae0,memberName,source);
      uVar37 = auStack_460._8_4_;
      local_468[0] = (_)local_2e8.isSet;
      if (local_2e8.isSet == true) {
        auStack_460._0_4_ = local_2e8.field_1.value.body.tag;
        auStack_460._8_4_ = (undefined4)local_2e8.field_1._8_7_;
        if (local_2e8.field_1.value.body.tag == 2) {
          auStack_460._12_4_ =
               (undefined4)(CONCAT17(local_2e8.field_1._15_1_,local_2e8.field_1._8_7_) >> 0x20);
          auStack_460._16_4_ = local_2e8.field_1._16_4_;
          auStack_460._20_4_ = local_2e8.field_1._20_4_;
          uVar37 = auStack_460._8_4_;
        }
        else if (local_2e8.field_1.value.body.tag == 1) {
          auStack_460._40_7_ = local_2e8.field_1._40_7_;
          auStack_460[0x2f] = local_2e8.field_1._47_1_;
          auStack_460._24_4_ = local_2e8.field_1._24_4_;
          auStack_460._28_4_ =
               (undefined4)
               (CONCAT17(local_2e8.field_1._31_1_,
                         CONCAT16(local_2e8.field_1._30_1_,
                                  CONCAT24(local_2e8.field_1._28_2_,local_2e8.field_1._24_4_))) >>
               0x20);
          auStack_460._32_7_ =
               (undefined7)CONCAT44(local_2e8.field_1._36_4_,local_2e8.field_1._32_4_);
          auStack_460[0x27] = (undefined1)((uint)local_2e8.field_1._36_4_ >> 0x18);
          auStack_460._12_4_ =
               (undefined4)(CONCAT17(local_2e8.field_1._15_1_,local_2e8.field_1._8_7_) >> 0x20);
          auStack_460._16_4_ = local_2e8.field_1._16_4_;
          auStack_460._20_4_ = local_2e8.field_1._20_4_;
          auStack_460[0x30] = local_2e8.field_1._48_1_;
          uVar37 = auStack_460._8_4_;
          if (local_2e8.field_1._48_1_ == 1) {
            auStack_460._88_8_ = local_2e8.field_1._88_8_;
            auStack_460._96_8_ = local_2e8.field_1._96_8_;
            auStack_460._72_8_ = local_2e8.field_1._72_8_;
            auStack_460._80_8_ = local_2e8.field_1._80_8_;
            auStack_460._56_8_ = local_2e8.field_1._56_8_;
            auStack_460._64_8_ = local_2e8.field_1._64_8_;
            local_2e8.field_1._48_1_ = 0;
          }
        }
        auStack_460._8_4_ = uVar37;
        auStack_460._104_4_ = local_2e8.field_1._104_4_;
        auStack_460._108_4_ = local_2e8.field_1._108_4_;
        auStack_460._116_4_ = local_2e8.field_1._116_4_;
        auStack_460._112_4_ = local_2e8.field_1._112_4_;
        auStack_460._120_4_ = local_2e8.field_1._120_4_;
        auStack_460._124_4_ = local_2e8.field_1._124_4_;
        auStack_460._128_4_ = local_2e8.field_1._128_4_;
        auStack_460._132_4_ = local_2e8.field_1._132_4_;
        auStack_460._136_4_ = local_2e8.field_1._136_4_;
        auStack_460._140_4_ = local_2e8.field_1._140_4_;
        auStack_460._144_4_ = local_2e8.field_1._144_4_;
        auStack_460._148_4_ = local_2e8.field_1._148_4_;
        auStack_460._152_4_ = local_2e8.field_1.value.source._reader.dataSize;
        auStack_460._156_4_ = local_2e8.field_1._156_4_;
        auStack_460._160_4_ = local_2e8.field_1.value.source._reader.nestingLimit;
        auStack_460._164_4_ = local_2e8.field_1._164_4_;
        if (local_2e8.field_1.value.body.tag == 1) {
          local_208 = CONCAT44(auStack_460._12_4_,auStack_460._8_4_);
          if (source._reader.dataSize < 0x40) {
            local_218 = 0;
            local_214 = 0;
          }
          else {
            local_218 = *(undefined4 *)(puVar4 + 2);
            local_214 = 0;
            if (0x9f < source._reader.dataSize) {
              local_214 = *(undefined4 *)(puVar4 + 8);
            }
          }
          local_210 = 1;
          (*this->errorReporter->_vptr_ErrorReporter[2])();
          if (local_210 - 1U < 2) {
            local_210 = 0;
          }
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.body.tag = 1;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
               CONCAT44(auStack_460._12_4_,auStack_460._8_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(auStack_460._20_4_,auStack_460._16_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
               CONCAT44(auStack_460._28_4_,auStack_460._24_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
               CONCAT17(auStack_460[0x27],auStack_460._32_7_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
               CONCAT17(auStack_460[0x2f],auStack_460._40_7_);
          *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = auStack_460[0x30];
          if (auStack_460[0x30] != 0) {
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
                 auStack_460._88_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) =
                 auStack_460._96_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
                 auStack_460._72_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
                 auStack_460._80_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
                 auStack_460._56_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
                 auStack_460._64_8_;
            auStack_460[0x30] = 0;
          }
        }
        else {
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.body.tag = local_2e8.field_1.value.body.tag;
          if (local_2e8.field_1.value.body.tag == 2) {
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 CONCAT44(auStack_460._12_4_,auStack_460._8_4_);
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
                 CONCAT44(auStack_460._20_4_,auStack_460._16_4_);
          }
        }
        (__return_storage_ptr__->ptr).field_1.value.brand.disposer =
             (Disposer *)CONCAT44(auStack_460._108_4_,auStack_460._104_4_);
        (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)auStack_460._112_8_;
        auStack_460._112_8_ = (BrandScope *)0x0;
        pNVar8 = &__return_storage_ptr__->ptr;
        *(undefined4 *)((long)&pNVar8->field_1 + 0x98) = auStack_460._152_4_;
        *(short *)((long)&pNVar8->field_1 + 0x9c) = (short)auStack_460._156_4_;
        *(short *)((long)&pNVar8->field_1 + 0x9e) = SUB42(auStack_460._156_4_,2);
        *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
             CONCAT44(auStack_460._164_4_,auStack_460._160_4_);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.data =
             (void *)CONCAT44(auStack_460._140_4_,auStack_460._136_4_);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
             (WirePointer *)CONCAT44(auStack_460._148_4_,auStack_460._144_4_);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
             (SegmentReader *)CONCAT44(auStack_460._124_4_,auStack_460._120_4_);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
             (CapTableReader *)CONCAT44(auStack_460._132_4_,auStack_460._128_4_);
      }
      else {
        if (source._reader.pointerCount == 0) {
          pCVar33 = (CapTableReader *)0x0;
          local_2e8.field_1._16_4_ = 0x7fffffff;
          pWVar20 = (WirePointer *)0x0;
          pSVar17 = (SegmentReader *)0x0;
        }
        else {
          pSVar17 = local_2f0;
          local_2e8.field_1._16_4_ = (int)local_3b8;
        }
        pEVar3 = this->errorReporter;
        local_2e8._0_4_ = SUB84(pSVar17,0);
        local_2e8._4_4_ = SUB84((ulong)pSVar17 >> 0x20,0);
        local_2e8.field_1.value.body.tag = (uint)pCVar33;
        local_2e8.field_1._4_4_ = (undefined4)((ulong)pCVar33 >> 0x20);
        local_2e8.field_1._8_7_ = SUB87(pWVar20,0);
        local_2e8.field_1._15_1_ = (undefined1)((ulong)pWVar20 >> 0x38);
        capnp::_::PointerReader::getStruct(&local_f0,(PointerReader *)&local_2e8,(word *)0x0);
        name_00._reader.segment._4_4_ = in_stack_fffffffffffffae4;
        name_00._reader.segment._0_4_ = uVar39;
        name_00._reader.capTable._0_4_ = uVar38;
        name_00._reader.capTable._4_4_ = uVar41;
        name_00._reader.data._0_4_ = uVar43;
        name_00._reader.data._4_4_ = uVar45;
        name_00._reader.pointers._0_4_ = in_stack_fffffffffffffaf8;
        name_00._reader.pointers._4_2_ = in_stack_fffffffffffffafc;
        name_00._reader.pointers._6_2_ = in_stack_fffffffffffffafe;
        name_00._reader.dataSize = in_stack_fffffffffffffb00;
        name_00._reader._36_4_ = in_stack_fffffffffffffb04;
        name_00._reader.nestingLimit._0_1_ = in_stack_fffffffffffffb08;
        name_00._reader._41_7_ = in_stack_fffffffffffffb09;
        expressionString(name_00);
        RVar47 = LocatedText::Reader::getValue((Reader *)local_3a8);
        local_2e8._0_4_ = RVar47.super_StringPtr.content.ptr._0_4_;
        local_2e8._4_4_ = RVar47.super_StringPtr.content.ptr._4_4_;
        local_2e8.field_1.value.body.tag = RVar47.super_StringPtr.content.size_._0_4_;
        local_2e8.field_1._4_4_ = RVar47.super_StringPtr.content.size_._4_4_;
        kj::str<char_const(&)[2],kj::String,char_const(&)[24],capnp::Text::Reader,char_const(&)[2]>
                  ((String *)local_378,(kj *)0x57c9bf,(char (*) [2])&local_328,
                   (String *)"\' has no member named \'",&local_2e8.isSet,(Reader *)0x57c9bf,
                   (char (*) [2])local_f0.segment);
        pSVar17 = (SegmentReader *)local_378._0_8_;
        if (stack0xfffffffffffffc90 == (CapTableReader *)0x0) {
          pSVar17 = (SegmentReader *)0x524569;
        }
        uVar24 = 0;
        if (local_388 < 0x20) {
          uVar28 = 0;
        }
        else {
          uVar28 = (ulong)(local_398->offsetAndKind).value;
          if (0x3f < local_388) {
            uVar24 = (ulong)(local_398->field_1).upper32Bits;
          }
        }
        (**pEVar3->_vptr_ErrorReporter)
                  (pEVar3,uVar28,uVar24,pSVar17,
                   (long)&stack0xfffffffffffffc90->_vptr_CapTableReader +
                   (ulong)(stack0xfffffffffffffc90 == (CapTableReader *)0x0));
        kj::String::~String((String *)local_378);
        kj::String::~String(&local_328);
        (__return_storage_ptr__->ptr).isSet = false;
      }
      _Var15 = local_528._0_1_;
    }
    else {
      (__return_storage_ptr__->ptr).isSet = false;
      _Var15 = local_468[0];
    }
    if (((byte)_Var15 & 1) == 0) {
      return __return_storage_ptr__;
    }
    if (local_4b0 == (BrandScope *)0x0) {
      return __return_storage_ptr__;
    }
    (**(pBStack_4b8->super_Refcounted).super_Disposer._vptr_Disposer)
              (pBStack_4b8,
               (_func_int *)
               ((long)&(local_4b0->super_Refcounted).super_Disposer._vptr_Disposer +
               (long)(local_4b0->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
    return __return_storage_ptr__;
  case 0xb:
    bVar35 = source._reader.pointerCount == 0;
    if (bVar35) {
      pWVar20 = (WirePointer *)0x0;
    }
    uVar39 = source._reader.nestingLimit;
    if (bVar35) {
      uVar39 = 0x7fffffff;
    }
    uVar38 = 0;
    uVar41 = 0;
    uVar43 = 0;
    uVar45 = 0;
    if (!bVar35) {
      uVar38 = source._reader.segment._0_4_;
      uVar41 = source._reader.segment._4_4_;
      uVar43 = (uint)source._reader.capTable;
      uVar45 = source._reader.capTable._4_4_;
    }
    local_528 = (char *)CONCAT44(uVar41,uVar38);
    uVar38 = SUB84(pWVar20,0);
    uVar41 = (undefined4)((ulong)pWVar20 >> 0x20);
    capnp::_::PointerReader::getStruct
              ((StructReader *)local_3a8,(PointerReader *)&local_528,(word *)0x0);
    (*resolver->_vptr_Resolver[5])(&local_2e8);
    local_368 = (WirePointer *)0x0;
    iVar16 = 0x7fffffff;
    if (local_384 != 0) {
      local_368 = (WirePointer *)CONCAT44(BStack_38c,local_390);
      iVar16 = local_380;
    }
    local_378._0_4_ = 0;
    local_378._4_4_ = 0;
    uVar37 = 0;
    uVar40 = 0;
    if (local_384 != 0) {
      local_378._0_4_ = local_3a8._0_4_;
      local_378._4_4_ = local_3a8._4_4_;
      uVar37 = (undefined4)uStack_3a0;
      uVar40 = uStack_3a0._4_4_;
    }
    plVar7 = (long *)CONCAT17(local_2e8.field_1._31_1_,
                              CONCAT16(local_2e8.field_1._30_1_,
                                       CONCAT24(local_2e8.field_1._28_2_,local_2e8.field_1._24_4_)))
    ;
    stack0xfffffffffffffc90 = (CapTableReader *)CONCAT44(uVar40,uVar37);
    pWStack_360 = (WirePointer *)CONCAT44(pWStack_360._4_4_,iVar16);
    RVar47 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_378,(void *)0x0,0)
    ;
    (**(code **)(*plVar7 + 8))(&local_528,plVar7,RVar47.super_StringPtr.content.ptr);
    local_468[0] = local_528._0_1_;
    if (local_528._0_1_ != (_)0x1) {
      uVar39 = 0;
      uVar38 = 0;
      if (local_384 != 0) {
        uVar39 = local_3a8._0_4_;
        uVar38 = local_3a8._4_4_;
      }
      pEVar3 = this->errorReporter;
      local_528 = (char *)CONCAT44(uVar38,uVar39);
      RVar47 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_528,(void *)0x0,0);
      local_378._0_8_ = RVar47.super_StringPtr.content.ptr;
      local_528 = "Not defined: ";
      register0x00000010 = (CapTableReader *)(RVar47.super_StringPtr.content.size_ - 1);
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)&local_2e8,(_ *)&local_528,(ArrayPtr<const_char> *)local_378,
                 (ArrayPtr<const_char> *)local_378);
      lVar5 = CONCAT44(local_2e8.field_1._4_4_,local_2e8.field_1.value.body.tag);
      if (lVar5 == 0) {
        pcVar22 = "";
      }
      else {
        pcVar22 = (char *)CONCAT44(local_2e8._4_4_,local_2e8._0_4_);
      }
      uVar24 = 0;
      if (local_388 < 0x20) {
        uVar28 = 0;
      }
      else {
        uVar28 = (ulong)(local_398->offsetAndKind).value;
        if (0x3f < local_388) {
          uVar24 = (ulong)(local_398->field_1).upper32Bits;
        }
      }
      (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar28,uVar24,pcVar22,lVar5 + (ulong)(lVar5 == 0));
      lVar5 = CONCAT44(local_2e8._4_4_,local_2e8._0_4_);
      if (lVar5 != 0) {
        uVar6 = CONCAT44(local_2e8.field_1._4_4_,local_2e8.field_1.value.body.tag);
        local_2e8.isSet = false;
        local_2e8._1_3_ = 0;
        local_2e8._4_4_ = 0;
        local_2e8.field_1.value.body.tag = 0;
        local_2e8.field_1._4_4_ = 0;
        (*(code *)**(undefined8 **)CONCAT17(local_2e8.field_1._15_1_,local_2e8.field_1._8_7_))
                  ((undefined8 *)CONCAT17(local_2e8.field_1._15_1_,local_2e8.field_1._8_7_),lVar5,1,
                   uVar6,uVar6,0);
      }
      goto switchD_003e2c56_caseD_0;
    }
    uVar37 = uVar38;
    uVar40 = uVar41;
    uVar14 = uVar39;
    if ((uVar43 != 2) &&
       (uVar37 = auStack_460._8_4_, uVar40 = auStack_460._12_4_, uVar14 = auStack_460._16_4_,
       uVar43 == 1)) {
      auStack_460._40_7_ = (undefined7)CONCAT71(in_stack_fffffffffffffb09,in_stack_fffffffffffffb08)
      ;
      auStack_460[0x2f] = (undefined1)((uint7)in_stack_fffffffffffffb09 >> 0x30);
      auStack_460._28_4_ =
           (undefined4)
           (CONCAT26(in_stack_fffffffffffffafe,
                     CONCAT24(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8)) >> 0x20);
      auStack_460._32_7_ = (undefined7)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00)
      ;
      auStack_460[0x27] = (undefined1)((uint)in_stack_fffffffffffffb04 >> 0x18);
      auStack_460[0x30] = local_4f0;
      uVar37 = uVar38;
      uVar40 = uVar41;
      uVar14 = uVar39;
    }
    auStack_460._16_4_ = uVar14;
    auStack_460._12_4_ = uVar40;
    auStack_460._8_4_ = uVar37;
    auStack_460._0_4_ = uVar43;
    interpretResolve((BrandedDecl *)&local_528,this,resolver,(ResolveResult *)auStack_460,source);
    if (auStack_460._0_4_ == 1) {
      if (source._reader.dataSize < 0x40) {
        local_1b8 = 0;
        local_1b4 = 0;
      }
      else {
        local_1b8 = *(undefined4 *)(puVar4 + 2);
        local_1b4 = 0;
        if (0x9f < source._reader.dataSize) {
          local_1b4 = *(undefined4 *)(puVar4 + 8);
        }
      }
      local_1a8 = CONCAT44(auStack_460._12_4_,auStack_460._8_4_);
      local_1b0 = 1;
      (*this->errorReporter->_vptr_ErrorReporter[2])();
    }
    break;
  case 0xc:
    bVar35 = source._reader.pointerCount == 0;
    if (bVar35) {
      pWVar20 = (WirePointer *)0x0;
    }
    uVar39 = source._reader.nestingLimit;
    if (bVar35) {
      uVar39 = 0x7fffffff;
    }
    uVar38 = 0;
    uVar41 = 0;
    uVar43 = 0;
    uVar45 = 0;
    if (!bVar35) {
      uVar38 = source._reader.segment._0_4_;
      uVar41 = source._reader.segment._4_4_;
      uVar43 = (uint)source._reader.capTable;
      uVar45 = source._reader.capTable._4_4_;
    }
    local_528 = (char *)CONCAT44(uVar41,uVar38);
    uVar38 = SUB84(pWVar20,0);
    uVar41 = (undefined4)((ulong)pWVar20 >> 0x20);
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_2e8,(PointerReader *)&local_528,(word *)0x0);
    local_398 = (WirePointer *)0x0;
    local_390 = 0x7fffffff;
    if (local_2e8.field_1._28_2_ != 0) {
      local_398 = (WirePointer *)CONCAT44(local_2e8.field_1._20_4_,local_2e8.field_1._16_4_);
      local_390 = local_2e8.field_1._32_4_;
    }
    local_3a8[0] = false;
    local_3a8._1_3_ = 0;
    local_3a8._4_4_ = 0;
    uVar37 = 0;
    uVar40 = 0;
    if (local_2e8.field_1._28_2_ != 0) {
      local_3a8._0_4_ = local_2e8._0_4_;
      local_3a8._4_4_ = local_2e8._4_4_;
      uVar37 = local_2e8.field_1.value.body.tag;
      uVar40 = local_2e8.field_1._4_4_;
    }
    uStack_3a0 = (CapTableReader *)CONCAT44(uVar40,uVar37);
    RVar47 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_3a8,(void *)0x0,0)
    ;
    (*resolver->_vptr_Resolver[8])(&local_528,resolver,RVar47.super_StringPtr.content.ptr);
    if (local_528._0_1_ != (_)0x1) {
      uVar39._0_1_ = false;
      uVar39._1_3_ = 0;
      uVar38 = 0;
      if (local_2e8.field_1._28_2_ != 0) {
        uVar39 = local_2e8._0_4_;
        uVar38 = local_2e8._4_4_;
      }
      pEVar3 = this->errorReporter;
      local_528 = (char *)CONCAT44(uVar38,uVar39);
      RVar47 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_528,(void *)0x0,0);
      local_378._0_8_ = RVar47.super_StringPtr.content.ptr;
      local_528 = "Import failed: ";
      register0x00000010 = (CapTableReader *)(RVar47.super_StringPtr.content.size_ - 1);
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)local_3a8,(_ *)&local_528,(ArrayPtr<const_char> *)local_378,
                 (ArrayPtr<const_char> *)local_378);
      auVar21 = local_3a8;
      if (uStack_3a0 == (CapTableReader *)0x0) {
        auVar21 = (undefined1  [8])(SegmentReader *)0x524569;
      }
      uVar24 = 0;
      if ((uint)local_2e8.field_1._24_4_ < 0x20) {
        uVar28 = 0;
      }
      else {
        uVar28 = (ulong)*(uint *)CONCAT17(local_2e8.field_1._15_1_,local_2e8.field_1._8_7_);
        if (0x3f < (uint)local_2e8.field_1._24_4_) {
          uVar24 = (ulong)((uint *)CONCAT17(local_2e8.field_1._15_1_,local_2e8.field_1._8_7_))[1];
        }
      }
      (**pEVar3->_vptr_ErrorReporter)
                (pEVar3,uVar28,uVar24,auVar21,
                 (long)&uStack_3a0->_vptr_CapTableReader +
                 (ulong)(uStack_3a0 == (CapTableReader *)0x0));
      pCVar33 = uStack_3a0;
      auVar21 = local_3a8;
      if (local_3a8 != (undefined1  [8])0x0) {
        local_3a8 = (undefined1  [8])0x0;
        uStack_3a0 = (CapTableReader *)0x0;
        (**(code **)*local_398)(local_398,auVar21,1,pCVar33,pCVar33,0);
      }
      goto switchD_003e2c56_caseD_0;
    }
    startingScopeId = CONCAT44(uVar45,uVar43);
    local_1e8 = CONCAT22(in_stack_fffffffffffffafe,in_stack_fffffffffffffafc);
    if (in_stack_fffffffffffffb08 == '\x01') {
      auStack_460[0x1f] = (undefined1)local_4d0;
      auStack_460._32_7_ = (undefined7)((ulong)local_4d0 >> 8);
      auStack_460[0x27] = (undefined1)uStack_4c8;
      auStack_460._40_7_ = (undefined7)((ulong)uStack_4c8 >> 8);
      auStack_460[0xf] = (undefined1)local_4e0;
      auStack_460._16_4_ = (undefined4)((ulong)local_4e0 >> 8);
      auStack_460._20_3_ = (undefined3)((ulong)local_4e0 >> 0x28);
      auStack_460[0x17] = (undefined1)uStack_4d8;
      auStack_460._24_4_ = (undefined4)((ulong)uStack_4d8 >> 8);
      auStack_460._28_3_ = (undefined3)((ulong)uStack_4d8 >> 0x28);
      local_468[7] = local_4f0;
      auStack_460[3] = (undefined1)uStack_4ec;
      auStack_460._0_4_ = CONCAT13(auStack_460[3],(int3)((uint)_local_4f0 >> 8));
      auStack_460[7] = (undefined1)uStack_4e8;
      auStack_460._4_4_ = CONCAT13(auStack_460[7],(int3)((uint)uStack_4ec >> 8));
      auStack_460._8_4_ = (undefined4)((ulong)uStack_4e8 >> 8);
      auStack_460._12_3_ = (undefined3)((ulong)uStack_4e8 >> 0x28);
    }
    if (source._reader.dataSize < 0x40) {
      local_1d8 = 0;
      local_1d4 = 0;
    }
    else {
      local_1d8 = *(undefined4 *)(puVar4 + 2);
      local_1d4 = 0;
      if (0x9f < source._reader.dataSize) {
        local_1d4 = *(undefined4 *)(puVar4 + 8);
      }
    }
    local_1d0 = 1;
    local_1f8 = uVar41;
    iStack_1f4 = uVar39;
    iStack_1f0 = in_stack_fffffffffffffaf4;
    uStack_1ec = in_stack_fffffffffffffaf8;
    local_1c8 = startingScopeId;
    (*this->errorReporter->_vptr_ErrorReporter[2])();
    if (local_1d0 - 1U < 2) {
      local_1d0 = 0;
    }
    if (in_stack_fffffffffffffb08 != '\0') {
      local_178 = CONCAT35(auStack_460._4_3_,CONCAT41(auStack_460._0_4_,local_468[7]));
      uStack_170 = CONCAT35(auStack_460._12_3_,CONCAT41(auStack_460._8_4_,auStack_460[7]));
      local_168 = CONCAT35(auStack_460._20_3_,CONCAT41(auStack_460._16_4_,auStack_460[0xf]));
      uStack_160 = CONCAT35(auStack_460._28_3_,CONCAT41(auStack_460._24_4_,auStack_460[0x17]));
      local_158 = CONCAT71(auStack_460._32_7_,auStack_460[0x1f]);
      uStack_150 = CONCAT71(auStack_460._40_7_,auStack_460[0x27]);
    }
    pEVar3 = this->errorReporter;
    pBVar18 = (BrandScope *)operator_new(0x50);
    BrandScope(pBVar18,pEVar3,startingScopeId,uVar38,
               (Resolver *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    puVar1 = &(pBVar18->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.body.tag = 1;
    *(uint64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = startingScopeId;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 8) = uVar38;
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x14) = CONCAT44(iStack_1f4,local_1f8)
    ;
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x1c) =
         CONCAT44(uStack_1ec,iStack_1f0);
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 0x1c) =
         local_1e8;
    *(Resolver **)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
         (Resolver *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00);
    if (in_stack_fffffffffffffb08 != '\0') {
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_158;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uStack_150;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_168;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uStack_160;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = local_178;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uStack_170;
    }
    *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = in_stack_fffffffffffffb08
    ;
    (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)pBVar18;
    (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBVar18;
    uStack_48c = source._reader._36_4_;
    goto LAB_003e4479;
  default:
    kj::_::unreachable();
  }
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.body.tag = (uint)local_528;
  if ((uint)local_528 == 2) {
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar45,uVar43);
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = CONCAT44(uVar41,uVar38);
  }
  else if ((uint)local_528 == 1) {
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
         CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00);
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
         CONCAT44(in_stack_fffffffffffffaf4,uVar39);
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
         CONCAT26(in_stack_fffffffffffffafe,
                  CONCAT24(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar45,uVar43);
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = CONCAT44(uVar41,uVar38);
    *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = in_stack_fffffffffffffb08
    ;
    if (in_stack_fffffffffffffb08 == '\x01') {
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_4d0;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uStack_4c8;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_4e0;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uStack_4d8;
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
           CONCAT44(uStack_4ec,_local_4f0);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uStack_4e8;
    }
  }
  (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)local_4c0;
  (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBStack_4b8;
  source._reader.segment._0_4_ = (undefined4)local_4b0;
  source._reader.segment._4_4_ = local_4b0._4_4_;
  source._reader.capTable._0_4_ = uStack_4a8;
  source._reader.capTable._4_4_ = uStack_4a4;
  source._reader.data._0_4_ = local_4a0;
  source._reader.data._4_4_ = uStack_49c;
  source._reader.pointers._0_4_ = uStack_498;
  source._reader.pointers._4_4_ = uStack_494;
  source._reader.dataSize = local_490;
  source._reader.nestingLimit = SStack_488;
  source._reader._44_4_ = uStack_484;
LAB_003e4479:
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x78) =
       source._reader.segment._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x7c) =
       source._reader.segment._4_4_;
  *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x80) = (uint)source._reader.capTable;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x84) =
       source._reader.capTable._4_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) = source._reader.data._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) = source._reader.data._4_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) =
       source._reader.pointers._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) =
       source._reader.pointers._4_4_;
  *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) =
       source._reader.dataSize;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) = uStack_48c;
  *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = source._reader.nestingLimit;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) = source._reader._44_4_;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<BrandedDecl> BrandScope::compileDeclExpression(
    Expression::Reader source, Resolver& resolver,
    ImplicitParams implicitMethodParams) {
  switch (source.which()) {
    case Expression::UNKNOWN:
      // Error reported earlier.
      return kj::none;

    case Expression::POSITIVE_INT:
    case Expression::NEGATIVE_INT:
    case Expression::FLOAT:
    case Expression::STRING:
    case Expression::BINARY:
    case Expression::LIST:
    case Expression::TUPLE:
    case Expression::EMBED:
      errorReporter.addErrorOn(source, "Expected name.");
      return kj::none;

    case Expression::RELATIVE_NAME: {
      auto name = source.getRelativeName();
      auto nameValue = name.getValue();

      // Check implicit method params first.
      for (auto i: kj::indices(implicitMethodParams.params)) {
        if (implicitMethodParams.params[i].getName() == nameValue) {
          if (implicitMethodParams.scopeId == 0) {
            return BrandedDecl::implicitMethodParam(i);
          } else {
            return BrandedDecl(Resolver::ResolvedParameter {
                implicitMethodParams.scopeId, static_cast<uint16_t>(i) },
                Expression::Reader());
          }
        }
      }

      KJ_IF_SOME(r, resolver.resolve(nameValue)) {
        auto result = interpretResolve(resolver, r, source);
        if (r.is<Resolver::ResolvedDecl>()){
          errorReporter.reportResolution(Resolution {
            /* .startByte = */ source.getStartByte(),
            /* .endByte = */ source.getEndByte(),
            /* .target = */ Resolution::Type { r.get<Resolver::ResolvedDecl>().id },
          });
        }
        return kj::mv(result);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", nameValue));
        return kj::none;
      }
    }

    case Expression::ABSOLUTE_NAME: {
      auto name = source.getAbsoluteName();
      KJ_IF_SOME(r, resolver.getTopScope().resolver->resolveMember(name.getValue())) {
        auto result = interpretResolve(resolver, r, source);
        if (r.is<Resolver::ResolvedDecl>()){
          errorReporter.reportResolution(Resolution {
            /* .startByte = */ source.getStartByte(),
            /* .endByte = */ source.getEndByte(),
            /* .target = */ Resolution::Type { r.get<Resolver::ResolvedDecl>().id },
          });
        }
        return kj::mv(result);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", name.getValue()));
        return kj::none;
      }
    }